

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

bool __thiscall
QItemSelectionModel::isRowSelected(QItemSelectionModel *this,int row,QModelIndex *parent)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  QItemSelectionRange *pQVar1;
  long lVar2;
  QAbstractItemModel *pQVar3;
  int *piVar4;
  pointer pQVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  parameter_type pQVar10;
  long lVar11;
  long lVar12;
  pointer this_01;
  const_iterator cVar13;
  int iVar14;
  long lVar15;
  const_iterator cVar16;
  byte bVar17;
  uint column;
  QItemSelectionRange *selection;
  QModelIndex *this_02;
  ulong uVar18;
  long in_FS_OFFSET;
  vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> local_68;
  int local_50 [2];
  QModelIndex *local_48;
  long *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             *)(lVar2 + 0x78);
  pQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
            ::value(this_00);
  if ((pQVar10 == (parameter_type)0x0) ||
     ((((-1 < parent->r && (-1 < parent->c)) && ((parent->m).ptr != (QAbstractItemModel *)0x0)) &&
      (pQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                 ::value(this_00), pQVar10 != (parent->m).ptr)))) {
LAB_0045ef55:
    bVar6 = false;
  }
  else {
    if ((*(byte *)(lVar2 + 0xb8) & 4) != 0) {
      cVar16.i = *(QItemSelectionRange **)(lVar2 + 0xa0);
      lVar11 = *(long *)(lVar2 + 0xa8);
      lVar15 = lVar11 * 0x10;
      pQVar1 = cVar16.i + lVar11;
      local_50[0] = row;
      local_48 = parent;
      if (0 < lVar11 >> 2) {
        lVar11 = (lVar11 >> 2) + 1;
        do {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                *)local_50,cVar16);
          cVar13.i = cVar16.i;
          if (bVar6) goto LAB_0045ef4b;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                *)local_50,cVar16.i + 1);
          cVar13.i = cVar16.i + 1;
          if (bVar6) goto LAB_0045ef4b;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                *)local_50,cVar16.i + 2);
          cVar13.i = cVar16.i + 2;
          if (bVar6) goto LAB_0045ef4b;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                *)local_50,cVar16.i + 3);
          cVar13.i = cVar16.i + 3;
          if (bVar6) goto LAB_0045ef4b;
          cVar16.i = cVar16.i + 4;
          lVar11 = lVar11 + -1;
          lVar15 = lVar15 + -0x40;
        } while (1 < lVar11);
        lVar11 = lVar15 >> 4;
      }
      if (lVar11 == 1) {
LAB_0045ef21:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)local_50,cVar16);
        cVar13.i = cVar16.i;
        if (!bVar6) {
          cVar13.i = pQVar1;
        }
      }
      else if (lVar11 == 2) {
LAB_0045ef0c:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)local_50,cVar16);
        cVar13.i = cVar16.i;
        if (!bVar6) {
          cVar16.i = cVar16.i + 1;
          goto LAB_0045ef21;
        }
      }
      else {
        if (lVar11 != 3) goto LAB_0045ef5d;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)local_50,cVar16);
        cVar13.i = cVar16.i;
        if (!bVar6) {
          cVar16.i = cVar16.i + 1;
          goto LAB_0045ef0c;
        }
      }
LAB_0045ef4b:
      if (cVar13.i != pQVar1) goto LAB_0045ef55;
    }
LAB_0045ef5d:
    if (((*(byte *)(lVar2 + 0xb8) & 8) != 0) && (lVar11 = *(long *)(lVar2 + 0xa8), lVar11 != 0)) {
      this_02 = *(QModelIndex **)(lVar2 + 0xa0);
      piVar4 = &this_02->r;
      do {
        iVar7 = QPersistentModelIndex::row((QPersistentModelIndex *)this_02);
        if ((iVar7 <= row) &&
           (iVar7 = QPersistentModelIndex::row((QPersistentModelIndex *)&this_02->i), row <= iVar7))
        {
          cVar16.i = *(QItemSelectionRange **)(lVar2 + 0x88);
          lVar15 = *(long *)(lVar2 + 0x90);
          lVar12 = lVar15 * 0x10;
          pQVar1 = cVar16.i + lVar15;
          cVar13.i = cVar16.i;
          local_50[0] = row;
          local_48 = this_02;
          if (0 < lVar15 >> 2) {
            lVar15 = (lVar15 >> 2) + 1;
            do {
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                    *)local_50,cVar16);
              cVar13.i = cVar16.i;
              if (bVar6) goto LAB_0045f0e0;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                    *)local_50,cVar16.i + 1);
              cVar13.i = cVar16.i + 1;
              if (bVar6) goto LAB_0045f0e0;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                    *)local_50,cVar16.i + 2);
              cVar13.i = cVar16.i + 2;
              if (bVar6) goto LAB_0045f0e0;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                    *)local_50,cVar16.i + 3);
              cVar13.i = cVar16.i + 3;
              if (bVar6) goto LAB_0045f0e0;
              cVar16.i = cVar16.i + 4;
              lVar15 = lVar15 + -1;
              lVar12 = lVar12 + -0x40;
            } while (1 < lVar15);
            lVar15 = lVar12 >> 4;
            cVar13.i = cVar16.i;
          }
          if (lVar15 == 1) {
LAB_0045f0c7:
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)local_50,cVar13);
            if (!bVar6) {
              cVar13.i = pQVar1;
            }
          }
          else if (lVar15 == 2) {
LAB_0045f094:
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)local_50,cVar13);
            if (!bVar6) {
              cVar13.i = cVar13.i + 1;
              goto LAB_0045f0c7;
            }
          }
          else {
            if (lVar15 != 3) goto LAB_0045f0f3;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)local_50,cVar13);
            if (!bVar6) {
              cVar13.i = cVar13.i + 1;
              goto LAB_0045f094;
            }
          }
LAB_0045f0e0:
          if (cVar13.i != pQVar1) goto LAB_0045ef55;
        }
LAB_0045f0f3:
        this_02 = (QModelIndex *)&this_02->m;
      } while (this_02 != (QModelIndex *)(piVar4 + lVar11 * 4));
    }
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_00);
    iVar7 = (**(code **)(**(long **)(lVar2 + 0x78) + 0x80))(*(long **)(lVar2 + 0x78),parent);
    local_68.
    super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>::reserve
              (&local_68,*(long *)(lVar2 + 0x90) + *(long *)(lVar2 + 0xa8));
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<QList<QItemSelectionRange>::const_iterator,std::back_insert_iterator<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>>
              (*(QItemSelectionRange **)(lVar2 + 0xa0),
               *(QItemSelectionRange **)(lVar2 + 0xa0) + *(long *)(lVar2 + 0xa8),&local_68);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<QList<QItemSelectionRange>::const_iterator,std::back_insert_iterator<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>>
              (*(QItemSelectionRange **)(lVar2 + 0x88),
               *(QItemSelectionRange **)(lVar2 + 0x88) + *(long *)(lVar2 + 0x90),&local_68);
    bVar17 = 1;
    if (iVar7 < 1) {
      iVar14 = 0;
    }
    else {
      uVar18 = 0;
      iVar14 = 0;
      do {
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(this_00);
        pQVar3 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
        column = (uint)uVar18;
        (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                  (local_50,pQVar3,(ulong)(uint)row,uVar18,parent);
        if ((local_40 == (long *)0x0) ||
           (uVar8 = (**(code **)(*local_40 + 0x138))(local_40,local_50), (~uVar8 & 0x21) != 0)) {
          iVar14 = iVar14 + 1;
        }
        else {
          pQVar5 = local_68.
                   super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          this_01 = local_68.
                    super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_68.
              super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_68.
              super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            bVar17 = 0;
            goto LAB_0045f2c6;
          }
          while (bVar6 = QItemSelectionRangeRefCache::contains(this_01,row,column,parent), !bVar6) {
            this_01 = this_01 + 1;
            if (this_01 == pQVar5) {
              bVar17 = 0;
              goto LAB_0045f2c1;
            }
          }
          uVar8 = this_01->m_right;
          if ((int)column < (int)uVar8) {
            do {
              column = column + 1;
              QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::value(this_00);
              pQVar3 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
              (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                        (local_50,pQVar3,(ulong)(uint)row,(ulong)column,parent);
              if (local_40 == (long *)0x0) {
                uVar9 = 1;
              }
              else {
                uVar9 = (**(code **)(*local_40 + 0x138))(local_40,local_50);
                uVar9 = (uint)((~uVar9 & 0x21) != 0);
              }
              iVar14 = iVar14 + uVar9;
            } while (column != uVar8);
          }
          this_01->m_top = -1;
          this_01->m_left = -1;
          this_01->m_bottom = -1;
          this_01->m_right = -1;
          column = uVar8;
        }
        uVar18 = (ulong)(column + 1);
      } while ((int)(column + 1) < iVar7);
      bVar17 = 1;
    }
LAB_0045f2c1:
LAB_0045f2c6:
    if (local_68.
        super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
        ._M_impl.super__Vector_impl_data._M_start != (QItemSelectionRangeRefCache *)0x0) {
      operator_delete(local_68.
                      super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar6 = (bool)(bVar17 & iVar14 < iVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QItemSelectionModel::isRowSelected(int row, const QModelIndex &parent) const
{
    Q_D(const QItemSelectionModel);
    if (!d->model.value())
        return false;
    if (parent.isValid() && d->model != parent.model())
        return false;

    // return false if row exist in currentSelection (Deselect)
    if (d->currentCommand & Deselect) {
        const auto matches = [](auto row, const auto &parent) {
            return [row, &parent](const auto &selection) {
                return row >= selection.top() &&
                       row <= selection.bottom() &&
                       parent == selection.parent();
            };
        };
        if (std::any_of(d->currentSelection.cbegin(), d->currentSelection.cend(), matches(row, parent)))
            return false;
    }
    // return false if ranges in both currentSelection and ranges
    // intersect and have the same row contained
    if (d->currentCommand & Toggle) {
        for (const auto &selection : d->currentSelection) {
            if (row >= selection.top() && row <= selection.bottom()) {
                const auto intersects = [](auto row, const auto &selection) {
                    return [row, &selection](const auto &range) {
                        return row >= range.top() &&
                               row <= range.bottom() &&
                               selection.intersected(range).isValid();
                    };
                };
                if (std::any_of(d->ranges.cbegin(), d->ranges.cend(), intersects(row, selection)))
                    return false;
            }
        }
    }

    auto isSelectable = [&](int row, int column) {
        return isSelectableAndEnabled(d->model->index(row, column, parent).flags());
    };

    const int colCount = d->model->columnCount(parent);
    int unselectable = 0;
    std::vector<QItemSelectionRangeRefCache> cache;
    cache.reserve(d->currentSelection.size() + d->ranges.size());
    std::copy(d->currentSelection.begin(), d->currentSelection.end(), std::back_inserter(cache));
    std::copy(d->ranges.begin(), d->ranges.end(), std::back_inserter(cache));

    // check ranges and currentSelection
    for (int column = 0; column < colCount; ++column) {
        if (!isSelectable(row, column)) {
            ++unselectable;
            continue;
        }
        bool foundSelection = false;
        for (auto &curSel : cache) {
            if (curSel.contains(row, column, parent)) {
                const auto right = curSel.right();
                for (int i = column + 1; i <= right; ++i) {
                    if (!isSelectable(row, i))
                        ++unselectable;
                }
                column = right;
                foundSelection = true;
                curSel.invalidate();
                break;
            }
        }
        if (!foundSelection)
            return false;
    }
    return unselectable < colCount;
}